

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,position2di *pos,rect<int> *clip,SColor *color,
          u32 starttime,u32 currenttime,bool loop,bool center)

{
  uint uVar1;
  pointer prVar2;
  position2di pVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  dimension2d<int> dVar6;
  rect<int> *this_00;
  u32 frame;
  position2di p;
  
  frame = 0;
  bVar4 = getFrameNr(this,&frame,index,currenttime - starttime,loop);
  if (bVar4) {
    iVar5 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                      (this,(ulong)*(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).
                                                                 field_0x8 + (ulong)index * 0x28) +
                                            (ulong)frame * 8));
    if (CONCAT44(extraout_var,iVar5) != 0) {
      prVar2 = (this->Rectangles).m_data.
               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).field_0x8 +
                                 (ulong)index * 0x28) + 4 + (ulong)frame * 8);
      if (uVar1 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)prVar2) >>
                        4)) {
        this_00 = prVar2 + uVar1;
        pVar3 = *pos;
        p = pVar3;
        if (center) {
          dVar6 = core::rect<int>::getSize(this_00);
          p.Y = (int)((long)((ulong)(uint)(dVar6.Height >> 0x1f) << 0x20 | (ulong)dVar6 >> 0x20) /
                     -2) + pVar3.Y;
          p.X = (int)((long)((ulong)(uint)(dVar6.Width >> 0x1f) << 0x20 | (ulong)dVar6 & 0xffffffff)
                     / -2) + pVar3.X;
        }
        (*this->Driver->_vptr_IVideoDriver[0x30])
                  (this->Driver,CONCAT44(extraout_var,iVar5),&p,this_00,clip,(ulong)color->color,1);
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::position2di &pos,
		const core::rect<s32> *clip, const video::SColor &color,
		u32 starttime, u32 currenttime, bool loop, bool center)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, currenttime - starttime, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	const core::rect<s32> &r = Rectangles[rn];
	core::position2di p(pos);
	if (center) {
		p -= r.getSize() / 2;
	}
	Driver->draw2DImage(tex, p, r, clip, color, true);
}